

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::end_object(basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,json_visitor *visitor,error_code *ec)

{
  pointer ppVar1;
  
  this->nesting_depth_ = this->nesting_depth_ + -1;
  (*visitor->_vptr_basic_json_visitor[5])(visitor,this);
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  ppVar1 = (this->state_stack_).
           super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this->mark_level_ ==
      (int)((ulong)((long)ppVar1 -
                   (long)(this->state_stack_).
                         super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
    this->more_ = false;
  }
  (this->state_stack_).
  super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
  return;
}

Assistant:

void end_object(json_visitor& visitor, std::error_code& ec)
    {
        --nesting_depth_;
        visitor.end_object(*this, ec);
        more_ = !cursor_mode_;
        if (level() == mark_level_)
        {
            more_ = false;
        }
        state_stack_.pop_back();
    }